

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.hpp
# Opt level: O1

void __thiscall pugi::xpath_exception::~xpath_exception(xpath_exception *this)

{
  std::exception::~exception(&this->super_exception);
  operator_delete(this,0x18);
  return;
}

Assistant:

class PUGIXML_CLASS xpath_exception: public std::exception
	{
	private:
		xpath_parse_result _result;

	public:
		// Construct exception from parse result
		explicit xpath_exception(const xpath_parse_result& result);

		// Get error message
		virtual const char* what() const throw() PUGIXML_OVERRIDE;

		// Get parse result
		const xpath_parse_result& result() const;
	}